

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageNegate(gdImagePtr src)

{
  uint uVar1;
  code *pcVar2;
  int local_50;
  uint local_4c;
  int local_48;
  int local_44;
  FuncPtr f;
  int pxl;
  int new_pxl;
  int a;
  int b;
  int g;
  int r;
  int y;
  int x;
  gdImagePtr src_local;
  
  if (src == (gdImagePtr)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    pcVar2 = gdImageGetPixel;
    if (src->trueColor != 0) {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    for (g = 0; g < src->sy; g = g + 1) {
      for (r = 0; r < src->sx; r = r + 1) {
        uVar1 = (*pcVar2)(src,r,g);
        if (src->trueColor == 0) {
          local_44 = src->red[(int)uVar1];
        }
        else {
          local_44 = (int)(uVar1 & 0xff0000) >> 0x10;
        }
        if (src->trueColor == 0) {
          local_48 = src->green[(int)uVar1];
        }
        else {
          local_48 = (int)(uVar1 & 0xff00) >> 8;
        }
        if (src->trueColor == 0) {
          local_4c = src->blue[(int)uVar1];
        }
        else {
          local_4c = uVar1 & 0xff;
        }
        if (src->trueColor == 0) {
          local_50 = src->alpha[(int)uVar1];
        }
        else {
          local_50 = (int)(uVar1 & 0x7f000000) >> 0x18;
        }
        f._4_4_ = gdImageColorAllocateAlpha
                            (src,0xff - local_44,0xff - local_48,0xff - local_4c,local_50);
        if (f._4_4_ == -1) {
          f._4_4_ = gdImageColorClosestAlpha
                              (src,0xff - local_44,0xff - local_48,0xff - local_4c,local_50);
        }
        gdImageSetPixel(src,r,g,f._4_4_);
      }
    }
    src_local._4_4_ = 1;
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageNegate(gdImagePtr src)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);
			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			new_pxl = gdImageColorAllocateAlpha(src, 255-r, 255-g, 255-b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, 255-r, 255-g, 255-b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}